

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_generated_dispatch.c
# Opt level: O0

PFNGLGETNAMEDFRAMEBUFFERPARAMETERIVPROC epoxy_glGetNamedFramebufferParameteriv_resolver(void)

{
  PFNGLGETNAMEDFRAMEBUFFERPARAMETERIVPROC p_Var1;
  
  p_Var1 = (PFNGLGETNAMEDFRAMEBUFFERPARAMETERIVPROC)
           gl_provider_resolver
                     ("glGetNamedFramebufferParameteriv",
                      epoxy_glGetNamedFramebufferParameteriv_resolver::providers,
                      epoxy_glGetNamedFramebufferParameteriv_resolver::entrypoints);
  return p_Var1;
}

Assistant:

static PFNGLGETNAMEDFRAMEBUFFERPARAMETERIVPROC
epoxy_glGetNamedFramebufferParameteriv_resolver(void)
{
    static const enum gl_provider providers[] = {
        Desktop_OpenGL_4_5,
        GL_extension_GL_ARB_direct_state_access,
        gl_provider_terminator
    };
    static const uint32_t entrypoints[] = {
        20895 /* "glGetNamedFramebufferParameteriv" */,
        20895 /* "glGetNamedFramebufferParameteriv" */,
    };
    return gl_provider_resolver(entrypoint_strings + 20895 /* "glGetNamedFramebufferParameteriv" */,
                                providers, entrypoints);
}